

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O2

size_t duckdb_snappy::Compress
                 (char *input,size_t input_length,string *compressed,CompressionOptions options)

{
  size_t in_RAX;
  pointer compressed_00;
  size_t compressed_length;
  
  compressed_00 = (char *)0x0;
  compressed_length = in_RAX;
  std::__cxx11::string::resize((ulong)compressed);
  if (compressed->_M_string_length != 0) {
    compressed_00 = (compressed->_M_dataplus)._M_p;
  }
  RawCompress(input,input_length,compressed_00,&compressed_length,options);
  std::__cxx11::string::erase((ulong)compressed,compressed_length);
  return compressed_length;
}

Assistant:

size_t Compress(const char* input, size_t input_length, std::string* compressed,
                CompressionOptions options) {
  // Pre-grow the buffer to the max length of the compressed output
  STLStringResizeUninitialized(compressed, MaxCompressedLength(input_length));

  size_t compressed_length;
  RawCompress(input, input_length, string_as_array(compressed),
              &compressed_length, options);
  compressed->erase(compressed_length);
  return compressed_length;
}